

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

HTTPResponse * processHtml(HTTPResponse *__return_storage_ptr__,HTTPRequest *req)

{
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"OK",&local_79);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"text/html",&local_7a);
  readFile(&local_38,&req->filepath);
  HTTPResponse::HTTPResponse(__return_storage_ptr__,200,&local_58,&local_78,&local_38.first);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

HTTPResponse processHtml(HTTPRequest &req)
{
    return HTTPResponse(200, "OK", "text/html", readFile(req.filepath).first);
}